

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

void __thiscall llm_graph_input_embd::set_input(llm_graph_input_embd *this,llama_ubatch *ubatch)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long in_RSI;
  long in_RDI;
  int64_t n_tokens_1;
  int64_t n_embd;
  int64_t n_tokens;
  
  if (*(long *)(in_RSI + 0x10) != 0) {
    uVar1 = *(uint *)(in_RSI + 4);
    uVar2 = *(undefined8 *)(in_RDI + 8);
    uVar3 = *(undefined8 *)(in_RSI + 0x10);
    lVar4 = ggml_element_size(*(undefined8 *)(in_RDI + 8));
    ggml_backend_tensor_set(uVar2,uVar3,0,(ulong)uVar1 * lVar4);
  }
  if (*(long *)(in_RSI + 0x18) != 0) {
    lVar4 = *(long *)(*(long *)(in_RDI + 0x10) + 0x10);
    uVar1 = *(uint *)(in_RSI + 4);
    uVar2 = *(undefined8 *)(in_RDI + 0x10);
    uVar3 = *(undefined8 *)(in_RSI + 0x18);
    lVar5 = ggml_element_size(*(undefined8 *)(in_RDI + 0x10));
    ggml_backend_tensor_set(uVar2,uVar3,0,(ulong)uVar1 * lVar4 * lVar5);
  }
  return;
}

Assistant:

void llm_graph_input_embd::set_input(const llama_ubatch * ubatch) {
    if (ubatch->token) {
        const int64_t n_tokens = ubatch->n_tokens;

        ggml_backend_tensor_set(tokens, ubatch->token, 0, n_tokens*ggml_element_size(tokens));
    }

    if (ubatch->embd) {
        const int64_t n_embd   = embd->ne[0];
        const int64_t n_tokens = ubatch->n_tokens;

        ggml_backend_tensor_set(embd, ubatch->embd, 0, n_tokens*n_embd*ggml_element_size(embd));
    }
}